

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_smmla(DisasContext_conflict1 *s,arg_rrrr *a,_Bool round,_Bool sub)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 rh;
  TCGv_i32 rl;
  TCGv_i32 arg2;
  TCGv_i32 al;
  TCGv_i32 zero;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool sub_local;
  _Bool round_local;
  arg_rrrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,3);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    rh = load_reg(s,a->rn);
    rl = load_reg(s,a->rm);
    tcg_gen_muls2_i32_aarch64(tcg_ctx_00,rl,rh,rh,rl);
    if (a->ra != 0xf) {
      arg2 = load_reg(s,a->ra);
      if (sub) {
        al = tcg_const_i32_aarch64(tcg_ctx_00,0);
        tcg_gen_sub2_i32_aarch64(tcg_ctx_00,rl,rh,al,arg2,rl,rh);
        tcg_temp_free_i32(tcg_ctx_00,al);
      }
      else {
        tcg_gen_add_i32(tcg_ctx_00,rh,rh,arg2);
      }
      tcg_temp_free_i32(tcg_ctx_00,arg2);
    }
    if (round) {
      tcg_gen_shri_i32_aarch64(tcg_ctx_00,rl,rl,0x1f);
      tcg_gen_add_i32(tcg_ctx_00,rh,rh,rl);
    }
    tcg_temp_free_i32(tcg_ctx_00,rl);
    store_reg(s,a->rd,rh);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_smmla(DisasContext *s, arg_rrrr *a, bool round, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_muls2_i32(tcg_ctx, t2, t1, t1, t2);

    if (a->ra != 15) {
        TCGv_i32 t3 = load_reg(s, a->ra);
        if (sub) {
            /*
             * For SMMLS, we need a 64-bit subtract.  Borrow caused by
             * a non-zero multiplicand lowpart, and the correct result
             * lowpart for rounding.
             */
            TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
            tcg_gen_sub2_i32(tcg_ctx, t2, t1, zero, t3, t2, t1);
            tcg_temp_free_i32(tcg_ctx, zero);
        } else {
            tcg_gen_add_i32(tcg_ctx, t1, t1, t3);
        }
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (round) {
        /*
         * Adding 0x80000000 to the 64-bit quantity means that we have
         * carry in to the high word when the low word has the msb set.
         */
        tcg_gen_shri_i32(tcg_ctx, t2, t2, 31);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}